

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O3

void __thiscall UdpBitDht::findDhtValue(UdpBitDht *this,bdNodeId *id,string *key,uint32_t mode)

{
  bdNodeManager *pbVar1;
  pointer pcVar2;
  long *local_50 [2];
  long local_40 [2];
  
  pthread_mutex_lock((pthread_mutex_t *)&this->dhtMtx);
  pbVar1 = this->mBitDhtManager;
  pcVar2 = (key->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + key->_M_string_length);
  (*(pbVar1->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher[10])
            (pbVar1,id,local_50,(ulong)mode);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dhtMtx);
  return;
}

Assistant:

void UdpBitDht::findDhtValue(bdNodeId *id, std::string key, uint32_t mode) {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	mBitDhtManager->findDhtValue(id, key, mode);
}